

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  byte bVar2;
  Mem *pVal;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uchar uVar17;
  uchar uVar18;
  uint uVar19;
  char *zDate;
  byte *zDate_00;
  byte *pbVar20;
  ulong uVar21;
  bool bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  int M;
  int M_1;
  int D;
  int Y;
  int m;
  int h;
  double local_c0;
  int local_b0;
  int local_ac;
  sqlite3_context *local_a8;
  int local_9c;
  undefined8 local_98;
  int local_8c;
  DateTime local_88;
  double local_50;
  int *local_48;
  ulong local_40;
  undefined1 local_34 [4];
  
  p->s = 0.0;
  p->validJD = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->nFloor = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar4 = sqlite3NotPureFunc(context);
    if (iVar4 == 0) {
      return 1;
    }
    iVar4 = setDateTimeToCurrent(context,p);
    return iVar4;
  }
  pVal = *argv;
  local_a8 = context;
  if (1 < "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
          [pVal->flags & 0x3f] - 1) {
    pcVar10 = (char *)sqlite3ValueText(pVal,'\x01');
    if (pcVar10 == (char *)0x0) {
      return 1;
    }
    cVar1 = *pcVar10;
    uVar14 = (ulong)(cVar1 == '-');
    iVar4 = getDigits(pcVar10 + uVar14,"40f-21a-21d",&local_98,&local_b0,&local_ac);
    if (iVar4 == 3) {
      zDate = pcVar10 + uVar14 + 9;
      do {
        do {
          pbVar7 = (byte *)(zDate + 1);
          zDate = zDate + 1;
        } while ((ulong)*pbVar7 == 0x54);
      } while ((""[*pbVar7] & 1) != 0);
      iVar4 = parseHhMmSs(zDate,p);
      if (iVar4 != 0) {
        if (*zDate != '\0') goto LAB_001a55f5;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar4 = -(int)local_98;
      if (cVar1 != '-') {
        iVar4 = (int)local_98;
      }
      p->Y = iVar4;
      p->M = local_b0;
      p->D = local_ac;
      computeFloor(p);
      if (p->tz != 0) {
        computeJD(p);
      }
    }
    else {
LAB_001a55f5:
      iVar4 = parseHhMmSs(pcVar10,p);
      if (iVar4 != 0) {
        lVar9 = 0;
        do {
          bVar12 = pcVar10[lVar9];
          if (bVar12 == "now"[lVar9]) {
            if ((ulong)bVar12 == 0) goto LAB_001a563f;
          }
          else if (""[bVar12] != ""[(byte)"now"[lVar9]]) goto LAB_001a5651;
          lVar9 = lVar9 + 1;
        } while( true );
      }
    }
    goto LAB_001a56cc;
  }
  dVar3 = sqlite3VdbeRealValue(pVal);
  uVar23 = SUB84(dVar3,0);
  uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
LAB_001a54ec:
  p->s = (double)CONCAT44(uVar24,uVar23);
  p->field_0x2c = p->field_0x2c | 1;
  if ((0.0 <= (double)CONCAT44(uVar24,uVar23)) &&
     ((double)CONCAT44(uVar24,uVar23) <= 5373484.5 && (double)CONCAT44(uVar24,uVar23) != 5373484.5))
  {
    p->iJD = (long)((double)CONCAT44(uVar24,uVar23) * 86400000.0 + 0.5);
    p->validJD = '\x01';
  }
  goto LAB_001a56cc;
LAB_001a563f:
  iVar4 = sqlite3NotPureFunc(local_a8);
  if (iVar4 == 0) {
LAB_001a5651:
    sVar8 = strlen(pcVar10);
    iVar4 = sqlite3AtoF(pcVar10,(double *)&local_88,(uint)sVar8 & 0x3fffffff,'\x01');
    if (iVar4 < 1) {
      lVar9 = 0;
      do {
        bVar12 = pcVar10[lVar9];
        if (bVar12 == "subsec"[lVar9]) {
          if ((ulong)bVar12 == 0) goto LAB_001a652a;
        }
        else if (""[bVar12] != ""[(byte)"subsec"[lVar9]]) {
          lVar9 = 0;
          goto LAB_001a6508;
        }
        lVar9 = lVar9 + 1;
      } while( true );
    }
    uVar23 = (undefined4)local_88.iJD;
    uVar24 = (undefined4)((ulong)local_88.iJD >> 0x20);
    goto LAB_001a54ec;
  }
  goto LAB_001a653c;
LAB_001a6508:
  bVar12 = pcVar10[lVar9];
  if (bVar12 == "subsecond"[lVar9]) {
    if ((ulong)bVar12 == 0) goto LAB_001a652a;
  }
  else if (""[bVar12] != ""[(byte)"subsecond"[lVar9]]) {
    return 1;
  }
  lVar9 = lVar9 + 1;
  goto LAB_001a6508;
LAB_001a652a:
  iVar4 = sqlite3NotPureFunc(local_a8);
  if (iVar4 == 0) {
    return 1;
  }
  p->field_0x2c = p->field_0x2c | 4;
LAB_001a653c:
  iVar4 = setDateTimeToCurrent(local_a8,p);
  if (iVar4 != 0) {
    return 1;
  }
LAB_001a56cc:
  if (argc < 2) {
LAB_001a6480:
    computeJD(p);
    if ((p->field_0x2c & 2) != 0) {
      return 1;
    }
    if (0x1a6401072fdff < (ulong)p->iJD) {
      return 1;
    }
    if (argc != 1) {
      return 0;
    }
    if (p->validYMD != '\0') {
      if (0x1c < p->D) {
        p->validYMD = '\0';
        return 0;
      }
      return 0;
    }
    return 0;
  }
  local_48 = &p->Y;
  local_40 = (ulong)(uint)argc;
  uVar14 = 1;
  local_8c = argc;
LAB_001a5703:
  pbVar7 = (byte *)sqlite3ValueText(argv[uVar14],'\x01');
  sqlite3ValueBytes(argv[uVar14],'\x01');
  if (pbVar7 == (byte *)0x0) {
    return 1;
  }
  bVar12 = *pbVar7;
  uVar21 = (ulong)bVar12;
  bVar2 = ""[uVar21];
  if (bVar2 < 0x61) {
    if (0x39 < bVar2) {
      return 1;
    }
    if ((0x3ff280000000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
      return 1;
    }
    zDate_00 = pbVar7 + 1;
    uVar21 = 1;
    while( true ) {
      bVar2 = pbVar7[uVar21];
      if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) break;
      if (bVar2 == 0x2d) {
        if ((int)uVar21 == 6) {
          iVar4 = getDigits((char *)zDate_00,"50f",&local_b0);
          if (iVar4 == 1) {
            uVar16 = 6;
            goto LAB_001a57f1;
          }
        }
        else if (((int)uVar21 == 5) &&
                (iVar4 = getDigits((char *)zDate_00,"40f",&local_b0), iVar4 == 1)) {
          uVar16 = 5;
          goto LAB_001a57f1;
        }
      }
      uVar21 = uVar21 + 1;
    }
    uVar16 = uVar21 & 0xffffffff;
LAB_001a57f1:
    iVar4 = 1;
    iVar5 = sqlite3AtoF((char *)pbVar7,(double *)&local_98,(int)uVar16,'\x01');
    argc = local_8c;
    if (0 < iVar5) {
      pbVar20 = pbVar7;
      if (pbVar7[uVar21] == 0x2d) {
        if ((bVar12 == 0x2d) || (bVar12 == 0x2b)) {
          if ((int)uVar16 == 5) {
            iVar5 = getDigits((char *)zDate_00,"40f-20a-20d",&local_b0,&local_ac,&local_9c);
            zDate_00 = pbVar7;
          }
          else {
            iVar5 = getDigits((char *)zDate_00,"50f-20a-20d",&local_b0,&local_ac,&local_9c);
          }
          iVar15 = local_9c;
          iVar6 = local_ac;
          argc = local_8c;
          if ((iVar5 == 3) && (local_9c < 0x1f && local_ac < 0xc)) {
            computeYMD(p);
            computeHMS(p);
            p->validJD = '\0';
            iVar5 = local_b0;
            if (bVar12 == 0x2d) {
              iVar6 = -iVar6;
              iVar15 = -iVar15;
              iVar5 = -local_b0;
              local_9c = iVar15;
            }
            iVar6 = p->M + iVar6;
            if (iVar6 < 1) {
              uVar19 = -((0xcU - iVar6) / 0xc);
            }
            else {
              uVar19 = (iVar6 - 1U) / 0xc;
            }
            p->Y = p->Y + iVar5 + uVar19;
            p->M = iVar6 + uVar19 * -0xc;
            computeFloor(p);
            computeJD(p);
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->iJD = p->iJD + (long)iVar15 * 86400000;
            argc = local_8c;
            if ((ulong)zDate_00[0xb] == 0) {
              iVar4 = 0;
            }
            else if ((""[zDate_00[0xb]] & 1) != 0) {
              pbVar7 = zDate_00 + 0xc;
              iVar5 = getDigits((char *)pbVar7,"20c:20e",local_34);
              uVar16 = 2;
              pbVar20 = zDate_00;
              argc = local_8c;
              if (iVar5 == 2) goto LAB_001a58c4;
            }
          }
        }
      }
      else {
LAB_001a58c4:
        if (pbVar7[uVar16] == 0x3a) {
          local_88.s = 0.0;
          local_88.validJD = '\0';
          local_88.validYMD = '\0';
          local_88.validHMS = '\0';
          local_88.nFloor = '\0';
          local_88._44_4_ = 0;
          local_88.D = 0;
          local_88.h = 0;
          local_88.m = 0;
          local_88.tz = 0;
          local_88.iJD = 0;
          local_88.Y = 0;
          local_88.M = 0;
          iVar5 = parseHhMmSs((char *)(pbVar7 + ((ulong)*pbVar7 - 0x3a < 0xfffffffffffffff6)),
                              &local_88);
          iVar4 = 1;
          argc = local_8c;
          if (iVar5 == 0) {
            computeJD(&local_88);
            lVar13 = (local_88.iJD + -43200000) % 86400000;
            lVar9 = -lVar13;
            if (bVar12 != 0x2d) {
              lVar9 = lVar13;
            }
            computeJD(p);
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->tz = 0;
            p->iJD = p->iJD + lVar9;
            iVar4 = 0;
            argc = local_8c;
          }
        }
        else {
          pbVar20 = pbVar20 + (uVar16 - 1);
          do {
            pbVar7 = pbVar20 + 1;
            pbVar20 = pbVar20 + 1;
          } while ((""[*pbVar7] & 1) != 0);
          sVar8 = strlen((char *)pbVar20);
          uVar19 = (uint)sVar8 & 0x3fffffff;
          argc = local_8c;
          if (0xfffffff7 < uVar19 - 0xb) {
            if ((pbVar20[uVar19 - 1] & 0xdf) == 0x53) {
              uVar19 = uVar19 - 1;
            }
            computeJD(p);
            local_c0 = (double)CONCAT44(local_98._4_4_,(int)local_98);
            dVar3 = *(double *)(&DAT_001c05e0 + (ulong)(local_c0 < 0.0) * 8);
            p->nFloor = '\0';
            lVar13 = 0x1c01a1;
            lVar9 = 0;
            do {
              if (uVar19 == aXformType[lVar9].nName) {
                uVar21 = 0;
                do {
                  if ((ulong)*(byte *)(lVar13 + uVar21) == 0) {
                    uVar18 = ""[pbVar20[uVar21]];
                    uVar17 = '\0';
LAB_001a5abd:
                    if (uVar17 != uVar18) goto LAB_001a5aec;
                    break;
                  }
                  uVar17 = ""[*(byte *)(lVar13 + uVar21)];
                  uVar18 = ""[pbVar20[uVar21]];
                  if (uVar17 != uVar18) goto LAB_001a5abd;
                  uVar21 = uVar21 + 1;
                } while (uVar19 != uVar21);
                if (((double)-aXformType[lVar9].rLimit < local_c0) &&
                   (local_c0 < (double)aXformType[lVar9].rLimit)) {
                  local_50 = dVar3;
                  if ((int)lVar9 == 5) {
                    computeYMD(p);
                    computeHMS(p);
                    p->Y = p->Y + (int)local_c0;
LAB_001a63e4:
                    computeFloor(p);
                    p->validJD = '\0';
                    local_c0 = local_c0 - (double)(int)local_c0;
                  }
                  else if ((int)lVar9 == 4) {
                    computeYMD(p);
                    computeHMS(p);
                    iVar4 = p->M + (int)local_c0;
                    if (iVar4 == 0 || SCARRY4(p->M,(int)local_c0) != iVar4 < 0) {
                      uVar19 = -((0xcU - iVar4) / 0xc);
                    }
                    else {
                      uVar19 = (iVar4 - 1U) / 0xc;
                    }
                    p->Y = p->Y + uVar19;
                    p->M = iVar4 + uVar19 * -0xc;
                    goto LAB_001a63e4;
                  }
                  computeJD(p);
                  p->iJD = p->iJD + (long)((double)aXformType[lVar9].rXform * local_c0 * 1000.0 +
                                          local_50);
                  iVar4 = 0;
                  goto LAB_001a644c;
                }
              }
LAB_001a5aec:
              lVar9 = lVar9 + 1;
              lVar13 = lVar13 + 0x10;
            } while (lVar9 != 6);
            iVar4 = 1;
LAB_001a644c:
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->tz = 0;
            argc = local_8c;
          }
        }
      }
    }
    goto LAB_001a6467;
  }
  if (bVar2 < 0x73) {
    switch(bVar2) {
    case 0x61:
      lVar9 = 0;
      break;
    default:
      return 1;
    case 99:
      lVar9 = 0;
      do {
        if ((byte)uVar21 == "ceiling"[lVar9]) {
          if ((byte)uVar21 == 0) goto LAB_001a5e24;
        }
        else if (""[uVar21] != ""[(byte)"ceiling"[lVar9]]) {
          return 1;
        }
        uVar21 = (ulong)pbVar7[lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while( true );
    case 0x66:
      lVar9 = 0;
      do {
        if ((byte)uVar21 == "floor"[lVar9]) {
          if ((byte)uVar21 == 0) goto LAB_001a5d94;
        }
        else if (""[uVar21] != ""[(byte)"floor"[lVar9]]) {
          return 1;
        }
        uVar21 = (ulong)pbVar7[lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while( true );
    case 0x6a:
      lVar9 = 0;
      do {
        if ((byte)uVar21 == "julianday"[lVar9]) {
          if ((byte)uVar21 == 0) goto LAB_001a5d2f;
        }
        else if (""[uVar21] != ""[(byte)"julianday"[lVar9]]) {
          return 1;
        }
        uVar21 = (ulong)pbVar7[lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while( true );
    case 0x6c:
      lVar9 = 0;
      do {
        if ((byte)uVar21 == "localtime"[lVar9]) {
          if ((byte)uVar21 == 0) goto LAB_001a5d55;
        }
        else if (""[uVar21] != ""[(byte)"localtime"[lVar9]]) {
          return 1;
        }
        uVar21 = (ulong)pbVar7[lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while( true );
    }
    do {
      if ((byte)uVar21 == "auto"[lVar9]) {
        if ((byte)uVar21 == 0) goto LAB_001a5dc9;
      }
      else if (""[uVar21] != ""[(byte)"auto"[lVar9]]) {
        return 1;
      }
      uVar21 = (ulong)pbVar7[lVar9 + 1];
      lVar9 = lVar9 + 1;
    } while( true );
  }
  if (bVar2 == 0x73) {
    uVar17 = '\0';
    if (bVar12 == 0) {
      pcVar10 = "start of ";
    }
    else {
      lVar9 = 0;
      uVar16 = uVar21;
      do {
        lVar13 = lVar9;
        uVar17 = ""[uVar16];
        if (uVar17 != ""[(byte)"start of "[lVar13]]) {
          pcVar10 = "start of " + lVar13;
          goto LAB_001a6241;
        }
        if (lVar13 == 8) goto LAB_001a624d;
        uVar16 = (ulong)pbVar7[lVar13 + 1];
        lVar9 = lVar13 + 1;
      } while (pbVar7[lVar13 + 1] != 0);
      pcVar10 = "start of " + lVar13 + 1;
      uVar17 = '\0';
    }
LAB_001a6241:
    if (uVar17 != ""[(byte)*pcVar10]) {
      lVar9 = 0;
      uVar16 = uVar21;
      do {
        if ((byte)uVar16 == "subsec"[lVar9]) {
          if ((byte)uVar16 == 0) goto LAB_001a634d;
        }
        else if (""[uVar16] != ""[(byte)"subsec"[lVar9]]) {
          lVar9 = 0;
          goto LAB_001a631d;
        }
        uVar16 = (ulong)pbVar7[lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while( true );
    }
LAB_001a624d:
    if (((p->validJD == '\0') && (p->validYMD == '\0')) && (p->validHMS == '\0')) {
      return 1;
    }
    computeYMD(p);
    p->validHMS = '\x01';
    p->h = 0;
    p->m = 0;
    p->s = 0.0;
    p->field_0x2c = p->field_0x2c & 0xfe;
    p->tz = 0;
    p->validJD = '\0';
    lVar9 = 0;
    do {
      bVar12 = pbVar7[lVar9 + 9];
      if (bVar12 == "month"[lVar9]) {
        if ((ulong)bVar12 == 0) goto LAB_001a62ec;
      }
      else if (""[bVar12] != ""[(byte)"month"[lVar9]]) {
        lVar9 = 0;
        goto LAB_001a62f7;
      }
      lVar9 = lVar9 + 1;
    } while( true );
  }
  if (bVar2 != 0x77) {
    if (bVar2 != 0x75) {
      return 1;
    }
    lVar9 = 0;
    uVar16 = uVar21;
    do {
      if ((byte)uVar16 == "unixepoch"[lVar9]) {
        if ((byte)uVar16 == 0) goto LAB_001a5e42;
      }
      else if (""[uVar16] != ""[(byte)"unixepoch"[lVar9]]) goto LAB_001a5e4d;
      uVar16 = (ulong)pbVar7[lVar9 + 1];
      lVar9 = lVar9 + 1;
    } while( true );
  }
  uVar17 = '\0';
  if (bVar12 == 0) {
    pcVar10 = "weekday ";
  }
  else {
    lVar9 = 0;
    do {
      lVar13 = lVar9;
      uVar17 = ""[uVar21];
      if (uVar17 != ""[(byte)"weekday "[lVar13]]) {
        pcVar10 = "weekday " + lVar13;
        goto LAB_001a6111;
      }
      if (lVar13 == 7) goto LAB_001a6121;
      uVar21 = (ulong)pbVar7[lVar13 + 1];
      lVar9 = lVar13 + 1;
    } while (pbVar7[lVar13 + 1] != 0);
    pcVar10 = "weekday " + lVar13 + 1;
    uVar17 = '\0';
  }
LAB_001a6111:
  if (uVar17 != ""[(byte)*pcVar10]) {
    return 1;
  }
LAB_001a6121:
  sVar8 = strlen((char *)(pbVar7 + 8));
  iVar4 = sqlite3AtoF((char *)(pbVar7 + 8),(double *)&local_98,(uint)sVar8 & 0x3fffffff,'\x01');
  if (iVar4 < 1) {
    return 1;
  }
  dVar3 = (double)CONCAT44(local_98._4_4_,(int)local_98);
  if (dVar3 < 0.0) {
    return 1;
  }
  if (7.0 <= dVar3) {
    return 1;
  }
  if (dVar3 != (double)(int)dVar3) {
    return 1;
  }
  if (NAN(dVar3) || NAN((double)(int)dVar3)) {
    return 1;
  }
  computeYMD(p);
  computeHMS(p);
  p->tz = 0;
  p->validJD = '\0';
  computeJD(p);
  lVar9 = (p->iJD + 0x7b98a00) / 86400000;
  lVar13 = (lVar9 / 7) * -7 + -7 + lVar9;
  if (lVar9 % 7 <= (long)(int)dVar3) {
    lVar13 = lVar9 % 7;
  }
  p->iJD = ((int)dVar3 - lVar13) * 86400000 + p->iJD;
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->tz = 0;
  goto LAB_001a646f;
LAB_001a631d:
  if ((byte)uVar21 == "subsecond"[lVar9]) {
    if ((byte)uVar21 == 0) goto LAB_001a634d;
  }
  else if (""[uVar21] != ""[(byte)"subsecond"[lVar9]]) {
    return 1;
  }
  uVar21 = (ulong)pbVar7[lVar9 + 1];
  lVar9 = lVar9 + 1;
  goto LAB_001a631d;
LAB_001a634d:
  p->field_0x2c = p->field_0x2c | 4;
  goto LAB_001a646f;
LAB_001a62f7:
  bVar12 = pbVar7[lVar9 + 9];
  if (bVar12 == "year"[lVar9]) {
    if ((ulong)bVar12 == 0) goto LAB_001a6353;
  }
  else if (""[bVar12] != ""[(byte)"year"[lVar9]]) {
    lVar9 = 0;
    goto LAB_001a636d;
  }
  lVar9 = lVar9 + 1;
  goto LAB_001a62f7;
LAB_001a636d:
  bVar12 = pbVar7[lVar9 + 9];
  if (bVar12 == "julianday"[lVar9 + 6]) {
    if ((ulong)bVar12 == 0) goto LAB_001a646f;
  }
  else if (""[bVar12] != ""[(byte)"julianday"[lVar9 + 6]]) {
    return 1;
  }
  lVar9 = lVar9 + 1;
  goto LAB_001a636d;
LAB_001a6353:
  p->M = 1;
  p->D = 1;
  goto LAB_001a646f;
LAB_001a62ec:
  p->D = 1;
  goto LAB_001a646f;
LAB_001a5e42:
  bVar12 = p->field_0x2c;
  if ((bVar12 & 1) == 0) {
LAB_001a5e4d:
    lVar9 = 0;
    do {
      if ((byte)uVar21 == "utc"[lVar9]) {
        if ((byte)uVar21 == 0) goto LAB_001a5e97;
      }
      else if (""[uVar21] != ""[(byte)"utc"[lVar9]]) {
        return 1;
      }
      uVar21 = (ulong)pbVar7[lVar9 + 1];
      lVar9 = lVar9 + 1;
    } while( true );
  }
  if (1 < uVar14) {
    return 1;
  }
  dVar3 = p->s * 1000.0 + 210866760000000.0;
  if (dVar3 < 0.0) {
    return 1;
  }
  if (464269060800000.0 <= dVar3) {
    return 1;
  }
LAB_001a5fc3:
  p->validHMS = '\0';
  p->tz = 0;
  p->iJD = (long)(dVar3 + 0.5);
  p->validJD = '\x01';
  p->validYMD = '\0';
LAB_001a5fe5:
  p->field_0x2c = bVar12 & 0xfe;
  goto LAB_001a646f;
LAB_001a5e97:
  iVar4 = sqlite3NotPureFunc(local_a8);
  if (iVar4 == 0) {
    return 1;
  }
  if ((p->field_0x2c & 8) == 0) {
    computeJD(p);
    lVar9 = p->iJD;
    lVar11 = 0;
    lVar13 = lVar9;
    uVar19 = 0;
    do {
      lVar13 = lVar13 - lVar11;
      local_88.m = 0;
      local_88.tz = 0;
      local_88.s = 0.0;
      local_88.Y = 0;
      local_88.M = 0;
      local_88.D = 0;
      local_88.h = 0;
      local_88.validJD = '\x01';
      local_88.validYMD = '\0';
      local_88.validHMS = '\0';
      local_88.nFloor = '\0';
      local_88._44_4_ = 0;
      local_88.iJD = lVar13;
      iVar4 = toLocaltime(&local_88,local_a8);
      if (iVar4 != 0) {
        return 1;
      }
      computeJD(&local_88);
      lVar11 = local_88.iJD - lVar9;
    } while ((lVar11 != 0) && (bVar22 = uVar19 < 3, uVar19 = uVar19 + 1, bVar22));
    *(undefined8 *)(local_48 + 4) = 0;
    *(double *)(local_48 + 6) = 0.0;
    local_48[0] = 0;
    local_48[1] = 0;
    *(undefined8 *)(local_48 + 2) = 0;
    *(undefined8 *)(local_48 + 8) = 0;
    p->iJD = lVar13;
    p->validJD = '\x01';
    p->field_0x2c = 8;
    argc = local_8c;
  }
  goto LAB_001a646f;
LAB_001a5d55:
  iVar4 = sqlite3NotPureFunc(local_a8);
  if (iVar4 == 0) {
    return 1;
  }
  bVar12 = p->field_0x2c;
  iVar4 = 0;
  if ((bVar12 & 0x10) == 0) {
    iVar4 = toLocaltime(p,local_a8);
    bVar12 = p->field_0x2c;
  }
  p->field_0x2c = bVar12 & 0xe7 | 0x10;
LAB_001a6467:
  if (iVar4 != 0) {
    return 1;
  }
LAB_001a646f:
  uVar14 = uVar14 + 1;
  if (uVar14 == local_40) goto LAB_001a6480;
  goto LAB_001a5703;
LAB_001a5d2f:
  if (1 < uVar14) {
    return 1;
  }
  if (p->validJD == '\0') {
    return 1;
  }
  bVar12 = p->field_0x2c;
  if ((bVar12 & 1) == 0) {
    return 1;
  }
  goto LAB_001a5fe5;
LAB_001a5d94:
  computeJD(p);
  p->iJD = p->iJD - ((long)p->nFloor * 0x5265c0000000000 >> 0x20);
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->tz = 0;
  goto LAB_001a646f;
LAB_001a5e24:
  computeJD(p);
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->tz = 0;
  p->nFloor = '\0';
  goto LAB_001a646f;
LAB_001a5dc9:
  if (1 < uVar14) {
    return 1;
  }
  bVar12 = p->field_0x2c;
  if (((bVar12 & 1) != 0) && (p->validJD == '\0')) {
    dVar3 = p->s;
    if ((dVar3 < -210866760000.0) || (253402300799.0 < dVar3)) goto LAB_001a646f;
    dVar3 = dVar3 * 1000.0 + 210866760000000.0;
    goto LAB_001a5fc3;
  }
  goto LAB_001a5fe5;
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  if( argc==1 && p->validYMD && p->D>28 ){
    /* Make sure a YYYY-MM-DD is normalized.
    ** Example: 2023-02-31 -> 2023-03-03 */
    assert( p->validJD );
    p->validYMD = 0;
  }
  return 0;
}